

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

int __thiscall jpgd::jpeg_decoder::decode(jpeg_decoder *this,void **pScan_line,uint *pScan_line_len)

{
  int iVar1;
  uint *pScan_line_len_local;
  void **pScan_line_local;
  jpeg_decoder *this_local;
  
  if ((this->m_error_code == JPGD_SUCCESS) && ((this->m_ready_flag & 1U) != 0)) {
    if (this->m_total_lines_left == 0) {
      this_local._4_4_ = 1;
    }
    else {
      if (this->m_mcu_lines_left == 0) {
        iVar1 = _setjmp((__jmp_buf_tag *)this);
        if (iVar1 != 0) {
          return -1;
        }
        if (this->m_progressive_flag == 0) {
          decode_next_row(this);
        }
        else {
          load_next_row(this);
        }
        if (this->m_total_lines_left <= this->m_max_mcu_y_size) {
          find_eoi(this);
        }
        this->m_mcu_lines_left = this->m_max_mcu_y_size;
      }
      if ((this->m_freq_domain_chroma_upsample & 1U) == 0) {
        switch(this->m_scan_type) {
        case 0:
          gray_convert(this);
          *pScan_line = this->m_pScan_line_0;
          break;
        case 1:
          H1V1Convert(this);
          *pScan_line = this->m_pScan_line_0;
          break;
        case 2:
          H2V1Convert(this);
          *pScan_line = this->m_pScan_line_0;
          break;
        case 3:
          if ((this->m_mcu_lines_left & 1U) == 0) {
            H1V2Convert(this);
            *pScan_line = this->m_pScan_line_0;
          }
          else {
            *pScan_line = this->m_pScan_line_1;
          }
          break;
        case 4:
          if ((this->m_mcu_lines_left & 1U) == 0) {
            H2V2Convert(this);
            *pScan_line = this->m_pScan_line_0;
          }
          else {
            *pScan_line = this->m_pScan_line_1;
          }
        }
      }
      else {
        expanded_convert(this);
        *pScan_line = this->m_pScan_line_0;
      }
      *pScan_line_len = this->m_real_dest_bytes_per_scan_line;
      this->m_mcu_lines_left = this->m_mcu_lines_left + -1;
      this->m_total_lines_left = this->m_total_lines_left + -1;
      this_local._4_4_ = 0;
    }
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int jpeg_decoder::decode(const void** pScan_line, uint* pScan_line_len)
{
  if ((m_error_code) || (!m_ready_flag))
    return JPGD_FAILED;

  if (m_total_lines_left == 0)
    return JPGD_DONE;

  if (m_mcu_lines_left == 0)
  {
    if (setjmp(m_jmp_state))
      return JPGD_FAILED;

    if (m_progressive_flag)
      load_next_row();
    else
      decode_next_row();

    // Find the EOI marker if that was the last row.
    if (m_total_lines_left <= m_max_mcu_y_size)
      find_eoi();

    m_mcu_lines_left = m_max_mcu_y_size;
  }

  if (m_freq_domain_chroma_upsample)
  {
    expanded_convert();
    *pScan_line = m_pScan_line_0;
  }
  else
  {
    switch (m_scan_type)
    {
      case JPGD_YH2V2:
      {
        if ((m_mcu_lines_left & 1) == 0)
        {
          H2V2Convert();
          *pScan_line = m_pScan_line_0;
        }
        else
          *pScan_line = m_pScan_line_1;

        break;
      }
      case JPGD_YH2V1:
      {
        H2V1Convert();
        *pScan_line = m_pScan_line_0;
        break;
      }
      case JPGD_YH1V2:
      {
        if ((m_mcu_lines_left & 1) == 0)
        {
          H1V2Convert();
          *pScan_line = m_pScan_line_0;
        }
        else
          *pScan_line = m_pScan_line_1;

        break;
      }
      case JPGD_YH1V1:
      {
        H1V1Convert();
        *pScan_line = m_pScan_line_0;
        break;
      }
      case JPGD_GRAYSCALE:
      {
        gray_convert();
        *pScan_line = m_pScan_line_0;

        break;
      }
    }
  }

  *pScan_line_len = m_real_dest_bytes_per_scan_line;

  m_mcu_lines_left--;
  m_total_lines_left--;

  return JPGD_SUCCESS;
}